

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.h
# Opt level: O2

long __thiscall
wasm::Random::
pick<long,signed_char,signed_char,short,short,int,int,long,long,unsigned_char,unsigned_short,unsigned_int,unsigned_long>
          (Random *this,long first,char args,char args_1,short args_2,short args_3,int args_4,
          int args_5,long args_6,long args_7,uchar args_8,unsigned_short args_9,uint args_10,
          unsigned_long args_11)

{
  uint32_t uVar1;
  long lVar2;
  
  uVar1 = upTo(this,0xd);
  lVar2 = pickGivenNum<long,signed_char,signed_char,short,short,int,int,long,long,unsigned_char,unsigned_short,unsigned_int,unsigned_long>
                    (this,(ulong)uVar1,first,args,args_1,args_2,args_3,args_4,args_5,args_6,args_7,
                     args_8,args_9,args_10,args_11);
  return lVar2;
}

Assistant:

T pick(T first, Args... args) {
    auto num = sizeof...(Args) + 1;
    auto temp = upTo(num);
    return pickGivenNum<T>(temp, first, args...);
  }